

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

void __thiscall CDevice::CheckPage(CDevice *this,ECheckPageLevel level)

{
  int iVar1;
  int badValue;
  ESlotOptions EVar2;
  CDeviceSlot *pCVar3;
  CDeviceSlot *pCVar4;
  CDevicePage *pCVar5;
  aint *paVar6;
  int iVar7;
  char *message;
  aint *paVar8;
  int iVar9;
  long lVar10;
  char buf [64];
  char acStack_78 [72];
  long lVar11;
  
  paVar8 = &CurAddress;
  if (0xffff < CurAddress && (level != CHECK_NO_EMIT && PseudoORG != DISP_NONE)) {
    if (pass == 3) {
      snprintf(acStack_78,0x40,"RAM limit exceeded 0x%X by DISP");
      Warning(acStack_78,(char *)0x0,W_PASS3);
    }
    CurAddress = CurAddress & 0xffff;
  }
  if (PseudoORG == DISP_NONE) {
    paVar6 = &CurAddress;
  }
  else {
    paVar6 = &adrdisp;
  }
  iVar7 = *paVar6;
  if (level != CHECK_RESET) {
    iVar1 = this->Slots[this->previousSlotI]->Address;
    if ((iVar1 <= iVar7) && (iVar7 < iVar1 + this->Slots[this->previousSlotI]->Size)) {
      return;
    }
  }
  lVar11 = (long)this->SlotsCount;
  do {
    lVar10 = lVar11 + -1;
    if (lVar11 == 0) {
      Error("CheckPage(..): please, contact the author of this program.",(char *)0x0,FATAL);
      return;
    }
    pCVar3 = this->Slots[lVar11 + -1];
    iVar1 = pCVar3->Address;
    lVar11 = lVar10;
  } while (iVar7 < iVar1);
  Page = pCVar3->Page;
  MemoryPointer = Page->RAM + (iVar7 - iVar1);
  iVar9 = (int)lVar10;
  if (level == CHECK_RESET) {
    this->previousSlotOpt = pCVar3->Option;
    this->previousSlotI = iVar9;
    this->limitExceeded = false;
    return;
  }
  badValue = this->previousSlotI;
  if ((badValue == iVar9) && (iVar7 < pCVar3->Size + iVar1)) {
    return;
  }
  if (iVar1 + pCVar3->Size <= iVar7) {
    MemoryPointer = (byte *)0x0;
  }
  EVar2 = this->previousSlotOpt;
  if (EVar2 == O_NEXT) {
    pCVar4 = this->Slots[badValue];
    iVar1 = pCVar4->Page->Number;
    if (iVar1 + 1 < this->PagesCount) {
      iVar7 = iVar7 - (pCVar4->Address + pCVar4->Size);
      if (iVar7 == 0) {
        pCVar5 = this->Pages[(long)iVar1 + 1];
        pCVar4->Page = pCVar5;
        if (PseudoORG != DISP_NONE) {
          paVar8 = &adrdisp;
        }
        Page = pCVar5;
        *paVar8 = *paVar8 - pCVar4->Size;
        MemoryPointer = pCVar5->RAM;
        return;
      }
      ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",iVar7,FATAL);
    }
    else {
      ErrorInt("No more memory pages to map next one into slot",badValue,SUPPRESS);
      pCVar4->Option = O_NONE;
      this->limitExceeded = false;
      this->previousSlotI = iVar9;
      this->previousSlotOpt = pCVar3->Option;
    }
  }
  else {
    if (EVar2 == O_WARNING) {
      if (((level != CHECK_EMIT) || (pass != 3)) || (this->limitExceeded != false))
      goto LAB_0010ba0c;
      Warning("Write outside of memory slot",(char *)0x0,W_PASS3);
    }
    else {
      if (EVar2 == O_ERROR) {
        if (((level != CHECK_EMIT) || (pass != 3)) || (this->limitExceeded != false))
        goto LAB_0010ba0c;
        message = "Write outside of memory slot";
      }
      else {
        if (((level != CHECK_EMIT) || (pass != 3)) ||
           ((this->limitExceeded != false || (MemoryPointer != (byte *)0x0)))) goto LAB_0010ba0c;
        message = "Write outside of device memory at";
      }
      ErrorInt(message,iVar7,SUPPRESS);
    }
    this->limitExceeded = true;
  }
LAB_0010ba0c:
  if (level == CHECK_EMIT) {
    this->limitExceeded = (bool)(this->limitExceeded & this->previousSlotI == iVar9);
    this->previousSlotI = iVar9;
    this->previousSlotOpt = pCVar3->Option;
  }
  return;
}

Assistant:

void CDevice::CheckPage(const ECheckPageLevel level) {
	// fake DISP address gets auto-wrapped FFFF->0 (with warning only)
	// only with "emit" mode, labels may get the value 0x10000 before the address gets truncated
	if (DISP_NONE != PseudoORG && CHECK_NO_EMIT != level && 0x10000 <= CurAddress) {
		if (LASTPASS == pass) {
			char buf[64];
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by DISP", (unsigned int)CurAddress);
			Warning(buf);
		}
		CurAddress &= 0xFFFF;
	}
	// check the emit address for bytecode
	const int realAddr = DISP_NONE != PseudoORG ? adrdisp : CurAddress;
	// quicker check to avoid scanning whole slots array every byte
	if (CHECK_RESET != level
		&& Slots[previousSlotI]->Address <= realAddr
		&& realAddr < Slots[previousSlotI]->Address + Slots[previousSlotI]->Size) return;
	for (int i=SlotsCount; i--; ) {
		CDeviceSlot* const S = Slots[i];
		if (realAddr < S->Address) continue;
		Page = S->Page;
		MemoryPointer = Page->RAM + (realAddr - S->Address);
 		if (CHECK_RESET == level) {
			previousSlotOpt = S->Option;
			previousSlotI = i;
			limitExceeded = false;
			return;
		}
		// if still in the same slot and within boundaries, we are done
		if (i == previousSlotI && realAddr < S->Address + S->Size) return;
		// crossing into other slot, check options for special functionality of old slot
		if (S->Address + S->Size <= realAddr) MemoryPointer = nullptr; // you're not writing there
		switch (previousSlotOpt) {
			case CDeviceSlot::O_ERROR:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					ErrorInt("Write outside of memory slot", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_WARNING:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					Warning("Write outside of memory slot");
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_NEXT:
			{
				CDeviceSlot* const prevS = Slots[previousSlotI];
				const int nextPageN = prevS->Page->Number + 1;
				if (PagesCount <= nextPageN) {
					ErrorInt("No more memory pages to map next one into slot", previousSlotI, SUPPRESS);
					// disable the option on the overflowing slot
					prevS->Option = CDeviceSlot::O_NONE;
					// reset error reporting even when level is CHECK_NO_EMIT, one error is enough
					limitExceeded = false;
					previousSlotI = i;
					previousSlotOpt = S->Option;
					break;		// continue into next slot, don't wrap any more
				}
				if (realAddr != (prevS->Address + prevS->Size)) {	// should be equal
					ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",
								realAddr - prevS->Address - prevS->Size, FATAL);
					break;
				}
				prevS->Page = Pages[nextPageN];		// map next page into the guarded slot
				Page = prevS->Page;
				if (DISP_NONE != PseudoORG) adrdisp -= prevS->Size;
				else CurAddress -= prevS->Size;
				MemoryPointer = Page->RAM;
				return;		// preserve current option status
			}
			default:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded && !MemoryPointer) {
					ErrorInt("Write outside of device memory at", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
		}
		// refresh check slot settings (only in CHECK_EMIT case, otherwise ParseLine will reset it with CHECK_NO_EMIT at BoL!)
		if (CHECK_EMIT == level) {
			limitExceeded &= (previousSlotI == i);	// reset limit flag if slot changed (in non check_reset mode)
			previousSlotI = i;
			previousSlotOpt = S->Option;
		}
		return;
	}
	Error("CheckPage(..): please, contact the author of this program.", nullptr, FATAL);
}